

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

bool __thiscall Ruleset::isSameType(Ruleset *this,Card *c1,Card *c2)

{
  bool bVar1;
  Suit SVar2;
  Suit SVar3;
  
  bVar1 = isTrump(this,c1);
  if ((bVar1) && (bVar1 = isTrump(this,c2), bVar1)) {
    return true;
  }
  bVar1 = isTrump(this,c1);
  if ((!bVar1) && (bVar1 = isTrump(this,c2), !bVar1)) {
    SVar2 = Card::suit(c1);
    SVar3 = Card::suit(c2);
    return SVar2 == SVar3;
  }
  return false;
}

Assistant:

bool Ruleset::isSameType(const Card &c1, const Card &c2) {
    if (isTrump(c1) && isTrump(c2)) return true;
    else {
        if (isTrump(c1) || isTrump(c2)) return false;
        return c1.suit() == c2.suit();
    }
}